

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O0

void __thiscall Am_Cursor_Data::~Am_Cursor_Data(Am_Cursor_Data *this)

{
  Am_Cursor_Data *this_local;
  
  ~Am_Cursor_Data(this);
  operator_delete(this);
  return;
}

Assistant:

Am_Cursor_Data::~Am_Cursor_Data()
{
  // needs to delete the linked list of cursor_items
  Cursor_Item *cl;
  cl = head;
  if (cl)
    while (cl->next) {
      delete head;
      head = cl->next;
      cl->next = cl->next->next;
    }
  delete head;
  remove(this);
}